

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O0

DdNode * Cudd_Eval(DdManager *dd,DdNode *f,int *inputs)

{
  uint *local_30;
  DdNode *ptr;
  int comple;
  int *inputs_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  ptr._4_4_ = (uint)f & 1;
  local_30 = (uint *)((ulong)f & 0xfffffffffffffffe);
  while (*local_30 != 0x7fffffff) {
    if (inputs[*local_30] == 1) {
      local_30 = *(uint **)(local_30 + 4);
    }
    else {
      ptr._4_4_ = (uint)*(undefined8 *)(local_30 + 6) & 1 ^ ptr._4_4_;
      local_30 = (uint *)(*(ulong *)(local_30 + 6) & 0xfffffffffffffffe);
    }
  }
  return (DdNode *)((ulong)local_30 ^ (long)(int)ptr._4_4_);
}

Assistant:

DdNode *
Cudd_Eval(
  DdManager * dd,
  DdNode * f,
  int * inputs)
{
    int comple;
    DdNode *ptr;

    comple = Cudd_IsComplement(f);
    ptr = Cudd_Regular(f);

    while (!cuddIsConstant(ptr)) {
        if (inputs[ptr->index] == 1) {
            ptr = cuddT(ptr);
        } else {
            comple ^= Cudd_IsComplement(cuddE(ptr));
            ptr = Cudd_Regular(cuddE(ptr));
        }
    }
    return(Cudd_NotCond(ptr,comple));

}